

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureUtil.cpp
# Opt level: O0

FilterMode glu::mapGLMinFilterMode(deUint32 filterMode)

{
  InternalError *this;
  deUint64 local_58;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  uint local_10;
  FilterMode local_c;
  deUint32 filterMode_local;
  
  if (filterMode == 0x2600) {
    local_c = NEAREST;
  }
  else if (filterMode == 0x2601) {
    local_c = LINEAR;
  }
  else if (filterMode == 0x2700) {
    local_c = NEAREST_MIPMAP_NEAREST;
  }
  else if (filterMode == 0x2701) {
    local_c = LINEAR_MIPMAP_NEAREST;
  }
  else if (filterMode == 0x2702) {
    local_c = NEAREST_MIPMAP_LINEAR;
  }
  else {
    if (filterMode != 0x2703) {
      local_10 = filterMode;
      this = (InternalError *)__cxa_allocate_exception(0x38);
      local_58 = (deUint64)tcu::toHex<unsigned_int>(local_10);
      tcu::Format::Hex<8ul>::toString_abi_cxx11_(&local_50,&local_58);
      std::operator+(&local_30,"Can\'t map GL min filter mode",&local_50);
      tcu::InternalError::InternalError(this,&local_30);
      __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
    }
    local_c = LINEAR_MIPMAP_LINEAR;
  }
  return local_c;
}

Assistant:

static inline tcu::Sampler::FilterMode mapGLMinFilterMode (deUint32 filterMode)
{
	switch (filterMode)
	{
		case GL_NEAREST:				return tcu::Sampler::NEAREST;
		case GL_LINEAR:					return tcu::Sampler::LINEAR;
		case GL_NEAREST_MIPMAP_NEAREST:	return tcu::Sampler::NEAREST_MIPMAP_NEAREST;
		case GL_NEAREST_MIPMAP_LINEAR:	return tcu::Sampler::NEAREST_MIPMAP_LINEAR;
		case GL_LINEAR_MIPMAP_NEAREST:	return tcu::Sampler::LINEAR_MIPMAP_NEAREST;
		case GL_LINEAR_MIPMAP_LINEAR:	return tcu::Sampler::LINEAR_MIPMAP_LINEAR;
		default:
			throw tcu::InternalError("Can't map GL min filter mode" + tcu::toHex(filterMode).toString());
	}
}